

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_xar.c
# Opt level: O1

int xar_finish_entry(archive_write *a)

{
  void *pvVar1;
  long lVar2;
  ssize_t sVar3;
  ulong uVar4;
  ulong s;
  
  pvVar1 = a->format_data;
  if (*(long *)((long)pvVar1 + 0x40) != 0) {
    uVar4 = *(ulong *)((long)pvVar1 + 0x48);
    while (uVar4 != 0) {
      s = a->null_length;
      if (uVar4 < a->null_length) {
        s = uVar4;
      }
      sVar3 = xar_write_data(a,a->nulls,s);
      if (sVar3 < 1) {
        return (int)sVar3;
      }
      uVar4 = *(long *)((long)pvVar1 + 0x48) - sVar3;
      *(ulong *)((long)pvVar1 + 0x48) = uVar4;
    }
    lVar2 = *(long *)((long)pvVar1 + 0x40);
    checksum_final((chksumwork_conflict *)((long)pvVar1 + 0xb0),
                   (chksumval_conflict *)(lVar2 + 0x128));
    checksum_final((chksumwork_conflict *)((long)pvVar1 + 0x98),
                   (chksumval_conflict *)(lVar2 + 0x100));
    *(undefined8 *)((long)pvVar1 + 0x40) = 0;
  }
  return 0;
}

Assistant:

static int
xar_finish_entry(struct archive_write *a)
{
	struct xar *xar;
	struct file *file;
	size_t s;
	ssize_t w;

	xar = (struct xar *)a->format_data;
	if (xar->cur_file == NULL)
		return (ARCHIVE_OK);

	while (xar->bytes_remaining > 0) {
		s = (size_t)xar->bytes_remaining;
		if (s > a->null_length)
			s = a->null_length;
		w = xar_write_data(a, a->nulls, s);
		if (w > 0)
			xar->bytes_remaining -= w;
		else
			return ((int)w);
	}
	file = xar->cur_file;
	checksum_final(&(xar->e_sumwrk), &(file->data.e_sum));
	checksum_final(&(xar->a_sumwrk), &(file->data.a_sum));
	xar->cur_file = NULL;

	return (ARCHIVE_OK);
}